

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffc2s(char *instr,char *outstr,int *status)

{
  size_t sVar1;
  ulong local_40;
  size_t ii;
  size_t len;
  int jj;
  int *status_local;
  char *outstr_local;
  char *instr_local;
  
  if (*status < 1) {
    if (*instr == '\'') {
      sVar1 = strlen(instr);
      len._4_4_ = 0;
      for (local_40 = 1; local_40 < sVar1; local_40 = local_40 + 1) {
        if (instr[local_40] == '\'') {
          if (instr[local_40 + 1] != '\'') break;
          local_40 = local_40 + 1;
        }
        outstr[len._4_4_] = instr[local_40];
        len._4_4_ = len._4_4_ + 1;
      }
      outstr[len._4_4_] = '\0';
      if (local_40 == sVar1) {
        ffpmsg("This string value has no closing quote (ffc2s):");
        ffpmsg(instr);
        *status = 0xcd;
        instr_local._4_4_ = 0xcd;
      }
      else {
        while ((len._4_4_ = len._4_4_ + -1, -1 < len._4_4_ && (outstr[len._4_4_] == ' '))) {
          outstr[len._4_4_] = '\0';
        }
        instr_local._4_4_ = *status;
      }
    }
    else if (*instr == '\0') {
      *outstr = '\0';
      *status = 0xcc;
      instr_local._4_4_ = 0xcc;
    }
    else {
      strcpy(outstr,instr);
      instr_local._4_4_ = *status;
    }
  }
  else {
    instr_local._4_4_ = *status;
  }
  return instr_local._4_4_;
}

Assistant:

int ffc2s(const char *instr,  /* I - null terminated quoted input string */
          char *outstr,       /* O - null terminated output string without quotes */
          int *status)        /* IO - error status */
/*
    convert an input quoted string to an unquoted string by removing
    the leading and trailing quote character.  Also, replace any
    pairs of single quote characters with just a single quote 
    character (FITS used a pair of single quotes to represent
    a literal quote character within the string).
*/
{
    int jj;
    size_t len, ii;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (instr[0] != '\'')
    {
        if (instr[0] == '\0') {
           outstr[0] = '\0';
           return(*status = VALUE_UNDEFINED);  /* null value string */
        } else {
          strcpy(outstr, instr);  /* no leading quote, so return input string */
          return(*status);
        }
    }

    len = strlen(instr);

    for (ii=1, jj=0; ii < len; ii++, jj++)
    {
        if (instr[ii] == '\'')  /*  is this the closing quote?  */
        {
            if (instr[ii+1] == '\'')  /* 2 successive quotes? */
                ii++;  /* copy only one of the quotes */
            else
                break;   /*  found the closing quote, so exit this loop  */
        }
        outstr[jj] = instr[ii];   /* copy the next character to the output */
    }

    outstr[jj] = '\0';             /*  terminate the output string  */

    if (ii == len)
    {
        ffpmsg("This string value has no closing quote (ffc2s):");
        ffpmsg(instr);
        return(*status = 205);
    }

    for (jj--; jj >= 0; jj--)  /* replace trailing blanks with nulls */
    {
        if (outstr[jj] == ' ')
            outstr[jj] = 0;
        else
            break;
    }

    return(*status);
}